

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

void Cec2_AddClausesSuper(Gia_Man_t *p,Gia_Obj_t *pNode,Vec_Ptr_t *vSuper,satoko_t *pSat)

{
  int iVar1;
  int iVar2;
  int *lits;
  void *pvVar3;
  long lVar4;
  int iVar5;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0xe8,
                  "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  if (((int)(uint)*(undefined8 *)pNode < 0) ||
     (((uint)*(undefined8 *)pNode & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0xe9,
                  "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
  }
  iVar2 = vSuper->nSize;
  lits = (int *)malloc((long)iVar2 * 4 + 4);
  iVar5 = 0;
  while (iVar1 = vSuper->nSize, iVar5 < iVar1) {
    pvVar3 = Vec_PtrEntry(vSuper,iVar5);
    iVar1 = Cec2_ObjSatId(p,(Gia_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe));
    iVar1 = Abc_Var2Lit(iVar1,(uint)pvVar3 & 1);
    *lits = iVar1;
    iVar1 = Cec2_ObjSatId(p,pNode);
    iVar1 = Abc_Var2Lit(iVar1,1);
    lits[1] = iVar1;
    iVar1 = satoko_add_clause(pSat,lits,2);
    iVar5 = iVar5 + 1;
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                    ,0xf9,
                    "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
    }
  }
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    pvVar3 = Vec_PtrEntry(vSuper,(int)lVar4);
    iVar5 = Cec2_ObjSatId(p,(Gia_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe));
    iVar5 = Abc_Var2Lit(iVar5,~(uint)pvVar3 & 1);
    lits[lVar4] = iVar5;
    iVar1 = vSuper->nSize;
  }
  iVar5 = Cec2_ObjSatId(p,pNode);
  iVar5 = Abc_Var2Lit(iVar5,0);
  lits[iVar2] = iVar5;
  iVar2 = satoko_add_clause(pSat,lits,iVar2 + 1);
  if (iVar2 != 0) {
    free(lits);
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                ,0x10a,
                "void Cec2_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, satoko_t *)");
}

Assistant:

void Cec2_AddClausesSuper( Gia_Man_t * p, Gia_Obj_t * pNode, Vec_Ptr_t * vSuper, satoko_t * pSat )
{
    int fPolarFlip = 0;
    Gia_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsAnd( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = Abc_Var2Lit(Cec2_ObjSatId(p, Gia_Regular(pFanin)), Gia_IsComplement(pFanin));
        pLits[1] = Abc_Var2Lit(Cec2_ObjSatId(p, pNode), 1);
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[0] = Abc_LitNot( pLits[0] );
            if ( pNode->fPhase )                pLits[1] = Abc_LitNot( pLits[1] );
        }
        RetValue = satoko_add_clause( pSat, pLits, 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[i] = Abc_Var2Lit(Cec2_ObjSatId(p, Gia_Regular(pFanin)), !Gia_IsComplement(pFanin));
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[i] = Abc_LitNot( pLits[i] );
        }
    }
    pLits[nLits-1] = Abc_Var2Lit(Cec2_ObjSatId(p, pNode), 0);
    if ( fPolarFlip )
    {
        if ( pNode->fPhase )  pLits[nLits-1] = Abc_LitNot( pLits[nLits-1] );
    }
    RetValue = satoko_add_clause( pSat, pLits, nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}